

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChConvexDecompositionHACD::GetConvexHullResult
          (ChConvexDecompositionHACD *this,uint hullIndex,ChTriangleMesh *convextrimesh)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong numCH;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  size_t *psVar9;
  size_t *psVar10;
  ulong uVar11;
  ulong uVar12;
  Vec3<double> *points;
  double local_88;
  double dStack_80;
  size_t local_78;
  double local_68;
  double dStack_60;
  size_t local_58;
  double local_48;
  double dStack_40;
  size_t local_38;
  
  numCH = (ulong)hullIndex;
  uVar1 = this->myHACD->m_nClusters;
  if (numCH <= uVar1) {
    sVar5 = HACD::HACD::GetNPointsCH(this->myHACD,numCH);
    sVar6 = HACD::HACD::GetNTrianglesCH(this->myHACD,numCH);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = sVar6;
    uVar7 = SUB168(auVar2 * ZEXT816(0x18),0);
    uVar12 = 0xffffffffffffffff;
    uVar11 = uVar7 + 8;
    if (0xfffffffffffffff7 < uVar7) {
      uVar11 = uVar12;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sVar5;
    uVar7 = SUB168(auVar3 * ZEXT816(0x18),0);
    if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
      uVar11 = uVar12;
    }
    uVar8 = uVar7 + 8;
    if (0xfffffffffffffff7 < uVar7) {
      uVar8 = uVar12;
    }
    if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
      uVar12 = uVar8;
    }
    psVar9 = (size_t *)operator_new__(uVar12);
    *psVar9 = sVar5;
    points = (Vec3<double> *)(psVar9 + 1);
    psVar10 = (size_t *)operator_new__(uVar11);
    *psVar10 = sVar6;
    HACD::HACD::GetCH(this->myHACD,numCH,points,(Vec3<long> *)(psVar10 + 1));
    for (uVar4 = 0; uVar12 = (ulong)uVar4, uVar12 < sVar6; uVar4 = uVar4 + 1) {
      uVar11 = (ulong)(uint)((Vec3<long> *)(psVar10 + 1))[uVar12].m_data[0];
      local_48 = points[uVar11].m_data[0];
      dStack_40 = points[uVar11].m_data[1];
      local_38 = psVar9[uVar11 * 3 + 3];
      local_88 = points[(uint)psVar10[uVar12 * 3 + 3]].m_data[0];
      dStack_80 = points[(uint)psVar10[uVar12 * 3 + 3]].m_data[1];
      local_68 = points[(uint)psVar10[uVar12 * 3 + 2]].m_data[0];
      dStack_60 = points[(uint)psVar10[uVar12 * 3 + 2]].m_data[1];
      local_58 = psVar9[(ulong)(uint)psVar10[uVar12 * 3 + 2] * 3 + 3];
      local_78 = psVar9[(ulong)(uint)psVar10[uVar12 * 3 + 3] * 3 + 3];
      (*(convextrimesh->super_ChGeometry)._vptr_ChGeometry[0xb])
                (convextrimesh,&local_48,&local_68,&local_88);
    }
    operator_delete__(psVar9,*psVar9 * 0x18 + 8);
    operator_delete__(psVar10,*psVar10 * 0x18 + 8);
  }
  return numCH <= uVar1;
}

Assistant:

bool ChConvexDecompositionHACD::GetConvexHullResult(unsigned int hullIndex, geometry::ChTriangleMesh& convextrimesh) {
    if (hullIndex > myHACD->GetNClusters())
        return false;

    size_t nPoints = myHACD->GetNPointsCH(hullIndex);
    size_t nTriangles = myHACD->GetNTrianglesCH(hullIndex);

    HACD::Vec3<HACD::Real>* pointsCH = new HACD::Vec3<HACD::Real>[nPoints];
    HACD::Vec3<long>* trianglesCH = new HACD::Vec3<long>[nTriangles];
    myHACD->GetCH(hullIndex, pointsCH, trianglesCH);

    for (unsigned int i = 0; i < nTriangles; i++) {
        unsigned int i1 = trianglesCH[i].X();
        unsigned int i2 = trianglesCH[i].Y();
        unsigned int i3 = trianglesCH[i].Z();
        convextrimesh.addTriangle(ChVector<>(pointsCH[i1].X(), pointsCH[i1].Y(), pointsCH[i1].Z()),
                                  ChVector<>(pointsCH[i2].X(), pointsCH[i2].Y(), pointsCH[i2].Z()),
                                  ChVector<>(pointsCH[i3].X(), pointsCH[i3].Y(), pointsCH[i3].Z()));
    }

    delete[] pointsCH;
    delete[] trianglesCH;

    return true;
}